

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::EnumValueOptions::SharedDtor(EnumValueOptions *this,MessageLite *self)

{
  InternalMetadata *this_00;
  FeatureSet *this_01;
  FieldOptions_FeatureSupport *this_02;
  bool bVar1;
  ulong uVar2;
  byte *pbVar3;
  _func_int **pp_Var4;
  MessageLite *pMVar5;
  _func_int **ptr;
  EnumValueOptions *this_03;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) != 0) {
    internal::InternalMetadata::DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>(this_00);
  }
  uVar2 = this_00->ptr_;
  if ((uVar2 & 1) != 0) {
    uVar2 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
  }
  if (uVar2 != 0) {
    this_03 = (EnumValueOptions *)&stack0xffffffffffffffe0;
    SharedDtor(this_03);
    pp_Var4 = ptr;
    if ((this_03->super_Message).super_MessageLite._vptr_MessageLite <= ptr) {
      pp_Var4 = (_func_int **)
                io::EpsCopyOutputStream::EnsureSpaceFallback
                          ((EpsCopyOutputStream *)this_03,(uint8_t *)ptr);
    }
    *(undefined1 *)pp_Var4 = 0x28;
    pbVar3 = (byte *)((long)pp_Var4 + 1);
    pMVar5 = self;
    if ((MessageLite *)0x7f < self) {
      do {
        *pbVar3 = (byte)pMVar5 | 0x80;
        self = (MessageLite *)((ulong)pMVar5 >> 7);
        pbVar3 = pbVar3 + 1;
        bVar1 = (MessageLite *)0x3fff < pMVar5;
        pMVar5 = self;
      } while (bVar1);
    }
    *pbVar3 = (byte)self;
    return;
  }
  this_01 = (this->field_0)._impl_.features_;
  if (this_01 != (FeatureSet *)0x0) {
    FeatureSet::~FeatureSet(this_01);
    operator_delete(this_01,0x48);
  }
  this_02 = (this->field_0)._impl_.feature_support_;
  if (this_02 != (FieldOptions_FeatureSupport *)0x0) {
    FieldOptions_FeatureSupport::~FieldOptions_FeatureSupport(this_02);
    operator_delete(this_02,0x30);
  }
  RepeatedPtrField<google::protobuf::UninterpretedOption>::~RepeatedPtrField
            (&(this->field_0)._impl_.uninterpreted_option_);
  internal::ExtensionSet::~ExtensionSet(&(this->field_0)._impl_._extensions_);
  return;
}

Assistant:

inline void EnumValueOptions::SharedDtor(MessageLite& self) {
  EnumValueOptions& this_ = static_cast<EnumValueOptions&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.features_;
  delete this_._impl_.feature_support_;
  this_._impl_.~Impl_();
}